

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O2

void __thiscall jrtplib::RTCPScheduler::ScheduleBYEPacket(RTCPScheduler *this,size_t packetsize)

{
  bool bVar1;
  RTPTime RVar2;
  
  if (this->byescheduled == false) {
    if (this->firstcall == true) {
      this->firstcall = false;
      this->pmembers = this->sources->activecount;
    }
    this->byescheduled = true;
    this->avgbyepacketsize = packetsize + this->headeroverhead;
    this->byemembers = 1;
    this->pbyemembers = 1;
    if (((this->schedparams).immediatebye != true) ||
       (bVar1 = true, 0x31 < this->sources->activecount)) {
      bVar1 = false;
    }
    this->sendbyenow = bVar1;
    RVar2 = RTPTime::CurrentTime();
    (this->prevrtcptime).m_t = RVar2.m_t;
    (this->nextrtcptime).m_t = RVar2.m_t;
    RVar2 = CalculateBYETransmissionInterval(this);
    (this->nextrtcptime).m_t = RVar2.m_t + (this->nextrtcptime).m_t;
  }
  return;
}

Assistant:

void RTCPScheduler::ScheduleBYEPacket(size_t packetsize)
{
	if (byescheduled)
		return;
	
	if (firstcall)
	{
		firstcall = false;
		pmembers = sources.GetActiveMemberCount();
	}

	byescheduled = true;
	avgbyepacketsize = packetsize+headeroverhead;

	// For now, we will always use the BYE backoff algorithm as described in rfc 3550 p 33
	
	byemembers = 1;
	pbyemembers = 1;

	if (schedparams.GetRequestImmediateBYE() && sources.GetActiveMemberCount() < 50) // p 34 (top)
		sendbyenow = true;
	else
		sendbyenow = false;
	
	prevrtcptime = RTPTime::CurrentTime();
	nextrtcptime = prevrtcptime;
	nextrtcptime += CalculateBYETransmissionInterval();
}